

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::ColorQuant::addColor(ColorQuant *this,RGBA color)

{
  uint32 addr_00;
  Node *this_00;
  Node *node;
  uint32 addr;
  ColorQuant *this_local;
  RGBA color_local;
  
  addr_00 = makeTreeAddr(color);
  this_00 = getNode(this,this->root,addr_00,8);
  Node::addColor(this_00,color);
  return;
}

Assistant:

void
ColorQuant::addColor(RGBA color)
{
	uint32 addr = makeTreeAddr(color);
	ColorQuant::Node *node = this->getNode(root, addr, QUANTDEPTH);
	node->addColor(color);
}